

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_tree.c
# Opt level: O0

void av1_free_shared_coeff_buffer(PC_TREE_SHARED_BUFFERS *shared_bufs)

{
  long in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    aom_free((void *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    *(undefined8 *)(in_RDI + (long)iVar1 * 8) = 0;
    *(undefined8 *)(in_RDI + 0x18 + (long)iVar1 * 8) = 0;
    *(undefined8 *)(in_RDI + 0x30 + (long)iVar1 * 8) = 0;
  }
  return;
}

Assistant:

void av1_free_shared_coeff_buffer(PC_TREE_SHARED_BUFFERS *shared_bufs) {
  for (int i = 0; i < 3; i++) {
    aom_free(shared_bufs->coeff_buf[i]);
    aom_free(shared_bufs->qcoeff_buf[i]);
    aom_free(shared_bufs->dqcoeff_buf[i]);
    shared_bufs->coeff_buf[i] = NULL;
    shared_bufs->qcoeff_buf[i] = NULL;
    shared_bufs->dqcoeff_buf[i] = NULL;
  }
}